

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O2

void PrintAddress(OutputContext *ctx,char *constantData,uchar rC,uint argument,VmConstant *constant,
                 VmValueType memoryType)

{
  undefined7 in_register_00000011;
  char *format;
  
  if (constantData == (char *)0x0 || (int)CONCAT71(in_register_00000011,rC) != 2) {
    if (rC != '\x03') {
      Print(ctx,"[");
      PrintRegister(ctx,rC);
      Print(ctx," + ");
      if (constant == (VmConstant *)0x0) {
        Print(ctx,"%d",(ulong)argument);
      }
      else {
        PrintConstant(ctx,constant);
      }
      Print(ctx,"]");
      return;
    }
    argument = argument >> 3;
    format = "r%d";
  }
  else {
    switch(memoryType) {
    case VM_TYPE_INT:
      Print(ctx,"%d @%d",(ulong)*(uint *)(constantData + argument),(ulong)argument);
      return;
    case VM_TYPE_DOUBLE:
      Print(ctx,"%f @%d",*(undefined8 *)(constantData + argument),(ulong)argument);
      return;
    case VM_TYPE_LONG:
    case VM_TYPE_POINTER:
      Print(ctx,"%lldl @%d",*(undefined8 *)(constantData + argument),(ulong)argument);
      return;
    default:
      format = "@%d";
    }
  }
  Print(ctx,format,(ulong)argument);
  return;
}

Assistant:

void PrintAddress(OutputContext &ctx, char *constantData, unsigned char rC, unsigned argument, VmConstant *constant, VmValueType memoryType)
{
	if(rC == rvrrConstants && constantData)
	{
		if(memoryType == VM_TYPE_INT || (memoryType == VM_TYPE_POINTER && NULLC_PTR_SIZE == 4))
		{
			int value = 0;
			memcpy(&value, constantData + argument, sizeof(value));
			Print(ctx, "%d @%d", value, argument);
		}
		else if(memoryType == VM_TYPE_DOUBLE)
		{
			double value = 0.0;
			memcpy(&value, constantData + argument, sizeof(value));
			Print(ctx, "%f @%d", value, argument);
		}
		else if(memoryType == VM_TYPE_LONG || (memoryType == VM_TYPE_POINTER && NULLC_PTR_SIZE == 8))
		{
			long long value = 0ll;
			memcpy(&value, constantData + argument, sizeof(value));
			Print(ctx, "%lldl @%d", value, argument);
		}
		else
		{
			Print(ctx, "@%d", argument);
		}
	}
	else if(rC == rvrrRegisters)
	{
		Print(ctx, "r%d", int(argument / sizeof(RegVmRegister)));
	}
	else
	{
		Print(ctx, "[");
		PrintRegister(ctx, rC);
		Print(ctx, " + ");

		if(constant)
			PrintConstant(ctx, constant);
		else
			Print(ctx, "%d", argument);

		Print(ctx, "]");
	}
}